

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::OpenRangeExpression::fromSyntax
          (Compilation *comp,OpenRangeExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange *pSVar1;
  bitmask<slang::ast::ASTFlags> this;
  bool bVar2;
  bitmask<slang::ast::ASTFlags> *this_00;
  ExpressionSyntax *pEVar3;
  Expression *args_1;
  Expression *args_2;
  Type *pTVar4;
  Compilation *pCVar5;
  SourceLocation location;
  Diagnostic *pDVar6;
  SVInt *this_01;
  SVInt *rhs;
  bool local_1ca;
  logic_t local_155 [13];
  undefined1 local_148 [8];
  ConstantValue cvr;
  ConstantValue cvl;
  Diagnostic *diag;
  Type *local_b8;
  SourceLocation local_b0;
  SourceLocation local_a8;
  undefined4 local_9c;
  Type *local_98;
  Type *local_90;
  not_null<const_slang::ast::Type_*> local_88;
  not_null<const_slang::ast::Type_*> rt;
  not_null<const_slang::ast::Type_*> lt;
  OpenRangeExpression *result;
  Expression *right;
  Expression *left;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  bitmask<slang::ast::ASTFlags> flags;
  ASTContext *context_local;
  OpenRangeExpressionSyntax *syntax_local;
  Compilation *comp_local;
  
  flags.m_bits = (underlying_type)context;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  this_00 = (bitmask<slang::ast::ASTFlags> *)(flags.m_bits + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_38,AllowUnboundedLiteral);
  bVar2 = bitmask<slang::ast::ASTFlags>::has(this_00,&local_38);
  if (bVar2) {
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&left,AllowUnboundedLiteral);
    local_30.m_bits = (underlying_type)left;
  }
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->left);
  args_1 = Expression::create(comp,pEVar3,(ASTContext *)flags.m_bits,local_30,(Type *)0x0);
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->right);
  args_2 = Expression::create(comp,pEVar3,(ASTContext *)flags.m_bits,local_30,(Type *)0x0);
  pTVar4 = Compilation::getVoidType(comp);
  _lt = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pCVar5 = (Compilation *)
           BumpAllocator::
           emplace<slang::ast::OpenRangeExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                     (&comp->super_BumpAllocator,pTVar4,args_1,args_2,(SourceRange *)&lt);
  bVar2 = Expression::bad(args_1);
  if ((bVar2) || (bVar2 = Expression::bad(args_2), bVar2)) {
    pCVar5 = (Compilation *)Expression::badExpr(comp,(Expression *)pCVar5);
    return (Expression *)pCVar5;
  }
  not_null<slang::ast::Type_const*>::not_null<slang::not_null<slang::ast::Type_const*>&,void>
            ((not_null<slang::ast::Type_const*> *)&rt,&args_1->type);
  not_null<slang::ast::Type_const*>::not_null<slang::not_null<slang::ast::Type_const*>&,void>
            ((not_null<slang::ast::Type_const*> *)&local_88,&args_2->type);
  pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&rt);
  bVar2 = Type::isUnbounded(pTVar4);
  if (bVar2) {
    local_98 = Compilation::getIntType(comp);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_90,&local_98);
    rt.ptr = local_90;
    pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&local_88);
    bVar2 = Type::isUnbounded(pTVar4);
    if (bVar2) {
      local_9c = 0x740007;
      pSVar1 = (SourceRange *)&(pCVar5->options).maxConstexprBacktrace;
      local_b0 = pSVar1->startLoc;
      local_a8 = *(SourceLocation *)&(pCVar5->options).maxInstanceArray;
      ASTContext::addDiag((ASTContext *)flags.m_bits,(DiagCode)0x740007,*pSVar1);
    }
  }
  pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&local_88);
  bVar2 = Type::isUnbounded(pTVar4);
  if (bVar2) {
    diag = (Diagnostic *)Compilation::getIntType(comp);
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_b8,(Type **)&diag);
    local_88.ptr = local_b8;
  }
  pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&rt);
  bVar2 = Type::isNumeric(pTVar4);
  if (bVar2) {
    pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&local_88);
    bVar2 = Type::isNumeric(pTVar4);
    if (bVar2) goto LAB_0069372e;
  }
  bVar2 = Expression::isImplicitString(args_1);
  if ((!bVar2) || (bVar2 = Expression::isImplicitString(args_2), !bVar2)) {
    this.m_bits = flags.m_bits;
    location = parsing::Token::location(&syntax->colon);
    pDVar6 = ASTContext::addDiag((ASTContext *)this.m_bits,(DiagCode)0x240007,location);
    pDVar6 = Diagnostic::operator<<(pDVar6,args_1->sourceRange);
    pDVar6 = Diagnostic::operator<<(pDVar6,args_2->sourceRange);
    pTVar4 = not_null<const_slang::ast::Type_*>::operator*(&rt);
    pDVar6 = ast::operator<<(pDVar6,pTVar4);
    pTVar4 = not_null<const_slang::ast::Type_*>::operator*(&local_88);
    ast::operator<<(pDVar6,pTVar4);
    pCVar5 = (Compilation *)Expression::badExpr(comp,(Expression *)pCVar5);
    return (Expression *)pCVar5;
  }
LAB_0069372e:
  ASTContext::tryEval((ConstantValue *)
                      ((long)&cvr.value.
                              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              .
                              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      + 0x20),(ASTContext *)flags.m_bits,args_1);
  ASTContext::tryEval((ConstantValue *)local_148,(ASTContext *)flags.m_bits,args_2);
  bVar2 = slang::ConstantValue::isInteger
                    ((ConstantValue *)
                     ((long)&cvr.value.
                             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     + 0x20));
  local_1ca = false;
  if (bVar2) {
    bVar2 = slang::ConstantValue::isInteger((ConstantValue *)local_148);
    local_1ca = false;
    if (bVar2) {
      this_01 = slang::ConstantValue::integer
                          ((ConstantValue *)
                           ((long)&cvr.value.
                                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           + 0x20));
      rhs = slang::ConstantValue::integer((ConstantValue *)local_148);
      local_155[0] = SVInt::operator>(this_01,rhs);
      local_1ca = logic_t::operator_cast_to_bool(local_155);
    }
  }
  if (local_1ca != false) {
    ASTContext::addDiag((ASTContext *)flags.m_bits,(DiagCode)0xa00007,
                        *(SourceRange *)&(pCVar5->options).maxConstexprBacktrace);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)local_148);
  slang::ConstantValue::~ConstantValue
            ((ConstantValue *)
             ((long)&cvr.value.
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             + 0x20));
  return (Expression *)pCVar5;
}

Assistant:

Expression& OpenRangeExpression::fromSyntax(Compilation& comp,
                                            const OpenRangeExpressionSyntax& syntax,
                                            const ASTContext& context) {
    // If we are allowed unbounded literals here, pass that along to subexpressions.
    bitmask<ASTFlags> flags = ASTFlags::None;
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral))
        flags = ASTFlags::AllowUnboundedLiteral;

    Expression& left = create(comp, *syntax.left, context, flags);
    Expression& right = create(comp, *syntax.right, context, flags);

    auto result = comp.emplace<OpenRangeExpression>(comp.getVoidType(), left, right,
                                                    syntax.sourceRange());
    if (left.bad() || right.bad())
        return badExpr(comp, result);

    auto lt = left.type;
    auto rt = right.type;
    if (lt->isUnbounded()) {
        lt = &comp.getIntType();
        if (rt->isUnbounded())
            context.addDiag(diag::OpenRangeUnbounded, result->sourceRange);
    }

    if (rt->isUnbounded())
        rt = &comp.getIntType();

    if (!(lt->isNumeric() && rt->isNumeric()) &&
        !(left.isImplicitString() && right.isImplicitString())) {
        auto& diag = context.addDiag(diag::BadOpenRange, syntax.colon.location());
        diag << left.sourceRange << right.sourceRange << *lt << *rt;
        return badExpr(comp, result);
    }

    auto cvl = context.tryEval(left);
    auto cvr = context.tryEval(right);
    if (cvl.isInteger() && cvr.isInteger() && bool(cvl.integer() > cvr.integer()))
        context.addDiag(diag::ReversedOpenRange, result->sourceRange);

    return *result;
}